

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O2

void __thiscall miniros::observer::Connection::Connection(Connection *this,Connection *other)

{
  Connection *pCVar1;
  Connection *pCVar2;
  mutex_t *__mutex;
  
  this->_vptr_Connection = (_func_int **)&PTR__Connection_002f0010;
  if (other->m_container != (Connections *)0x0) {
    __mutex = &other->m_container->m_mutex;
    std::recursive_mutex::lock(__mutex);
    pCVar1 = other->m_prev;
    this->m_prev = pCVar1;
    pCVar2 = other->m_next;
    this->m_next = pCVar2;
    if (pCVar1 != (Connection *)0x0) {
      pCVar1->m_next = this;
      pCVar2 = this->m_next;
    }
    if (pCVar2 != (Connection *)0x0) {
      pCVar2->m_prev = this;
    }
    this->m_container = other->m_container;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  other->m_container = (Connections *)0x0;
  other->m_prev = (Connection *)0x0;
  other->m_next = (Connection *)0x0;
  return;
}

Assistant:

Connection::Connection(Connection&& other) {
    if (other.m_container) {
        std::scoped_lock<impl::Connections> lock(*other.m_container);

        m_prev = other.m_prev;
        m_next = other.m_next;

        if (m_prev) {
            m_prev->m_next = this;
        }
        if (m_next) {
            m_next->m_prev = this;
        }
        m_container = other.m_container;
    }

    other.m_container = nullptr;
    other.m_next = nullptr;
    other.m_prev = nullptr;
}